

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte typecode;
  ushort key;
  _Bool _Var1;
  array_container_t *src_1;
  array_container_t *paVar2;
  run_container_t *dst;
  array_container_t *paVar3;
  array_container_t *paVar4;
  container_t *pcVar5;
  ushort *puVar6;
  uint uVar7;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint16_t uVar12;
  uint8_t result_type;
  byte local_71;
  uint local_70;
  byte local_6a;
  byte local_69;
  array_container_t *local_68;
  roaring_array_t *local_60;
  array_container_t *local_58;
  uint local_4c;
  container_t *local_48;
  uint local_3c;
  array_container_t *local_38;
  uint uVar8;
  
  result_type = '\0';
  local_4c = (x2->high_low_container).size;
  if (local_4c == 0) {
    return;
  }
  uVar9 = (x1->high_low_container).size;
  if (uVar9 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  uVar12 = *(x1->high_low_container).keys;
  puVar6 = (x2->high_low_container).keys;
  uVar11 = 0;
  uVar7 = 0;
  bVar10 = local_71;
  local_60 = &x2->high_low_container;
LAB_00111a55:
  do {
    key = *puVar6;
    uVar8 = uVar7;
    while( true ) {
      uVar7 = uVar8 + 1;
      if (uVar12 == key) break;
      if (key <= uVar12) {
        local_71 = local_60->typecodes[uVar11 & 0xffff];
        pcVar5 = get_copy_of_container
                           (local_60->containers[uVar11 & 0xffff],&local_71,
                            (_Bool)(local_60->flags & 1));
        bVar10 = local_71;
        if ((local_60->flags & 1) != 0) {
          local_68 = (array_container_t *)CONCAT44(local_68._4_4_,(uint)local_71);
          local_48 = pcVar5;
          ra_set_container_at_index(local_60,uVar11,pcVar5,local_71);
          bVar10 = (byte)local_68;
          pcVar5 = local_48;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar8,key,pcVar5,bVar10);
        uVar9 = uVar9 + 1;
        uVar11 = uVar11 + 1;
        uVar8 = local_4c;
        bVar10 = local_71;
        if (uVar11 == local_4c) goto LAB_00111e1c;
        puVar6 = (ushort *)((ulong)((uVar11 & 0xffff) * 2) + (long)local_60->keys);
        goto LAB_00111a55;
      }
      if (uVar9 == uVar7) goto LAB_00111dd4;
      uVar12 = (x1->high_low_container).keys[uVar7 & 0xffff];
      uVar8 = uVar7;
    }
    local_48 = (container_t *)CONCAT44(local_48._4_4_,uVar11);
    typecode = (x1->high_low_container).typecodes[(ulong)uVar8 & 0xffff];
    local_68 = (array_container_t *)(x1->high_low_container).containers[(ulong)uVar8 & 0xffff];
    local_3c = (uint)typecode;
    _Var1 = container_is_full(local_68,typecode);
    paVar2 = local_68;
    if (!_Var1) {
      bVar10 = local_60->typecodes[(ulong)local_48 & 0xffff];
      pcVar5 = local_60->containers[(ulong)local_48 & 0xffff];
      local_70 = uVar8;
      if (typecode == 4) {
        src_1 = (array_container_t *)container_or(local_68,'\x04',pcVar5,bVar10,&result_type);
        goto LAB_00111ccb;
      }
      local_6a = bVar10;
      local_69 = typecode;
      src_1 = (array_container_t *)get_writable_copy_if_shared(local_68,&local_69);
      paVar2 = (array_container_t *)container_unwrap_shared(pcVar5,&local_6a);
      local_38 = (array_container_t *)0x0;
      switch((uint)local_6a + (uint)local_69 * 4) {
      case 5:
        bitset_container_or((bitset_container_t *)src_1,(bitset_container_t *)paVar2,
                            (bitset_container_t *)src_1);
        if (src_1->cardinality != 0x10000) goto LAB_00111cbc;
        src_1 = (array_container_t *)run_container_create_range(0,0x10000);
        goto LAB_00111c8f;
      case 6:
        array_bitset_container_union(paVar2,(bitset_container_t *)src_1,(bitset_container_t *)src_1)
        ;
LAB_00111cbc:
        result_type = '\x01';
        paVar2 = local_68;
        break;
      case 7:
        _Var1 = run_container_is_full((run_container_t *)paVar2);
        paVar3 = src_1;
        if (!_Var1) {
LAB_00111cb7:
          run_bitset_container_union
                    ((run_container_t *)paVar2,(bitset_container_t *)paVar3,
                     (bitset_container_t *)src_1);
          goto LAB_00111cbc;
        }
        src_1 = (array_container_t *)run_container_create();
        result_type = '\x03';
        run_container_copy((run_container_t *)paVar2,(run_container_t *)src_1);
        paVar2 = local_68;
        break;
      default:
        local_71 = bVar10;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1553,
                      "container_t *container_ior(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                     );
      case 9:
        local_58 = paVar2;
        paVar3 = (array_container_t *)bitset_container_create();
        result_type = '\x01';
        array_bitset_container_union
                  (src_1,(bitset_container_t *)local_58,(bitset_container_t *)paVar3);
        paVar2 = local_68;
        src_1 = paVar3;
        break;
      case 10:
        _Var1 = array_array_container_inplace_union(src_1,paVar2,&local_38);
        result_type = '\x02' - _Var1;
        if (local_38 != (array_container_t *)0x0) {
          src_1 = local_38;
        }
        paVar2 = local_68;
        if (_Var1) {
          src_1 = local_38;
        }
        break;
      case 0xb:
        local_58 = paVar2;
        dst = run_container_create();
        array_run_container_union(src_1,(run_container_t *)local_58,dst);
        src_1 = (array_container_t *)convert_run_to_efficient_container_and_free(dst,&result_type);
        paVar2 = local_68;
        break;
      case 0xd:
        local_58 = paVar2;
        _Var1 = run_container_is_full((run_container_t *)src_1);
        if (!_Var1) {
          paVar4 = (array_container_t *)bitset_container_create();
          paVar3 = local_58;
          paVar2 = src_1;
          src_1 = paVar4;
          goto LAB_00111cb7;
        }
LAB_00111c8f:
        result_type = '\x03';
        paVar2 = local_68;
        break;
      case 0xe:
        array_run_container_inplace_union(paVar2,(run_container_t *)src_1);
        goto LAB_00111c32;
      case 0xf:
        run_container_union_inplace((run_container_t *)src_1,(run_container_t *)paVar2);
LAB_00111c32:
        src_1 = (array_container_t *)
                convert_run_to_efficient_container((run_container_t *)src_1,&result_type);
        paVar2 = local_68;
      }
LAB_00111ccb:
      uVar11 = local_70;
      if (src_1 != paVar2) {
        container_free(paVar2,(uint8_t)local_3c);
      }
      ra_set_container_at_index(&x1->high_low_container,uVar11,src_1,result_type);
    }
    uVar11 = (int)local_48 + 1;
    uVar8 = uVar11;
    if ((uVar9 == uVar7) || (uVar11 == local_4c)) {
LAB_00111e1c:
      local_71 = bVar10;
      uVar11 = uVar8;
      bVar10 = local_71;
      if (uVar7 != uVar9) {
        return;
      }
LAB_00111dd4:
      local_71 = bVar10;
      ra_append_copy_range
                (&x1->high_low_container,local_60,uVar11,local_4c,(_Bool)(local_60->flags & 1));
      return;
    }
    uVar12 = (x1->high_low_container).keys[uVar7 & 0xffff];
    puVar6 = (ushort *)((ulong)((uVar11 & 0xffff) * 2) + (long)local_60->keys);
  } while( true );
}

Assistant:

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,
                               const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            if (!container_is_full(c1, type1)) {
                container_t *c2 = ra_get_container_at_index(
                                        &x2->high_low_container, pos2, &type2);
                container_t *c =
                    (type1 == SHARED_CONTAINER_TYPE)
                        ? container_or(c1, type1, c2, type2, &result_type)
                        : container_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            // container_t *c2_clone = container_clone(c2, type2);
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}